

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

void Cof_ManInsertEntry_rec(Vec_Ptr_t *vNodes,Cof_Obj_t *pNode,int nNodeMax)

{
  int iVar1;
  int iVar2;
  Cof_Obj_t *pObj;
  Cof_Obj_t *pLast;
  int nNodeMax_local;
  Cof_Obj_t *pNode_local;
  Vec_Ptr_t *vNodes_local;
  
  iVar1 = Vec_PtrSize(vNodes);
  if (iVar1 == 0) {
    Vec_PtrPush(vNodes,pNode);
  }
  else {
    pObj = (Cof_Obj_t *)Vec_PtrPop(vNodes);
    iVar1 = Cof_ObjFanoutNum(pObj);
    iVar2 = Cof_ObjFanoutNum(pNode);
    if (iVar1 < iVar2) {
      Cof_ManInsertEntry_rec(vNodes,pNode,nNodeMax);
      iVar1 = Vec_PtrSize(vNodes);
      if (iVar1 < nNodeMax) {
        Vec_PtrPush(vNodes,pObj);
      }
    }
    else {
      Vec_PtrPush(vNodes,pObj);
      iVar1 = Vec_PtrSize(vNodes);
      if (iVar1 < nNodeMax) {
        Vec_PtrPush(vNodes,pNode);
      }
    }
  }
  return;
}

Assistant:

void Cof_ManInsertEntry_rec( Vec_Ptr_t * vNodes, Cof_Obj_t * pNode, int nNodeMax )
{
    Cof_Obj_t * pLast;
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrPush(vNodes, pNode);
        return;
    }
    pLast = (Cof_Obj_t *)Vec_PtrPop(vNodes);
    if ( Cof_ObjFanoutNum(pLast) < Cof_ObjFanoutNum(pNode) )
    {
        Cof_ManInsertEntry_rec( vNodes, pNode, nNodeMax );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pLast );
    }
    else
    {
        Vec_PtrPush( vNodes, pLast );
        if ( Vec_PtrSize(vNodes) < nNodeMax )
            Vec_PtrPush( vNodes, pNode );
    }
}